

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

void hydro_random_buf_deterministic(void *out,size_t out_len,uint8_t *seed)

{
  uint8_t *state_u8;
  void *in_RDX;
  uint64_t in_RSI;
  long in_RDI;
  size_t leftover;
  size_t i;
  uint8_t *p;
  uint8_t state [48];
  uint8_t in_stack_ffffffffffffff9f;
  uint8_t *in_stack_ffffffffffffffa0;
  ulong local_58;
  uint8_t local_48 [8];
  undefined8 local_40 [5];
  void *local_18;
  uint64_t local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  mem_zero(local_48,0x30);
  builtin_memcpy(local_48,"\adrbg256",8);
  store64_le((uint8_t *)local_40,local_10);
  gimli_core_u8(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
  mem_xor(local_48,local_18,0x10);
  gimli_core_u8(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
  mem_xor(local_48,(void *)((long)local_18 + 0x10),0x10);
  gimli_core_u8(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
  for (local_58 = 0; local_58 < local_10 >> 4; local_58 = local_58 + 1) {
    gimli_core_u8(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
    *(uint8_t (*) [8])(in_RDI + local_58 * 0x10) = local_48;
    *(undefined8 *)(in_RDI + 8 + local_58 * 0x10) = local_40[0];
  }
  state_u8 = (uint8_t *)(local_10 & 0xf);
  if (state_u8 != (uint8_t *)0x0) {
    gimli_core_u8(state_u8,in_stack_ffffffffffffff9f);
    mem_cpy((void *)(in_RDI + local_58 * 0x10),local_48,(size_t)state_u8);
  }
  return;
}

Assistant:

void
hydro_random_buf_deterministic(void *out, size_t out_len,
                               const uint8_t seed[hydro_random_SEEDBYTES])
{
    static const uint8_t             prefix[] = { 7, 'd', 'r', 'b', 'g', '2', '5', '6' };
    _hydro_attr_aligned_(16) uint8_t state[gimli_BLOCKBYTES];
    uint8_t                         *p = (uint8_t *) out;
    size_t                           i;
    size_t                           leftover;

    mem_zero(state, gimli_BLOCKBYTES);
    COMPILER_ASSERT(sizeof prefix + 8 <= gimli_RATE);
    memcpy(state, prefix, sizeof prefix);
    STORE64_LE(state + sizeof prefix, (uint64_t) out_len);
    gimli_core_u8(state, 1);
    COMPILER_ASSERT(hydro_random_SEEDBYTES == gimli_RATE * 2);
    mem_xor(state, seed, gimli_RATE);
    gimli_core_u8(state, 2);
    mem_xor(state, seed + gimli_RATE, gimli_RATE);
    gimli_core_u8(state, 2);
    for (i = 0; i < out_len / gimli_RATE; i++) {
        gimli_core_u8(state, 0);
        memcpy(p + i * gimli_RATE, state, gimli_RATE);
    }
    leftover = out_len % gimli_RATE;
    if (leftover != 0) {
        gimli_core_u8(state, 0);
        mem_cpy(p + i * gimli_RATE, state, leftover);
    }
}